

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop_info.cpp
# Opt level: O3

void __thiscall duckdb::DropInfo::DropInfo(DropInfo *this,DropInfo *info)

{
  pointer pcVar1;
  pointer pEVar2;
  
  (this->super_ParseInfo).info_type = (info->super_ParseInfo).info_type;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__DropInfo_0243b1e0;
  (this->super_ParseInfo).field_0x9 = (info->super_ParseInfo).field_0x9;
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  pcVar1 = (info->catalog)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->catalog,pcVar1,pcVar1 + (info->catalog)._M_string_length);
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  pcVar1 = (info->schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->schema,pcVar1,pcVar1 + (info->schema)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (info->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (info->name)._M_string_length);
  this->if_not_found = info->if_not_found;
  this->cascade = info->cascade;
  this->allow_drop_internal = info->allow_drop_internal;
  if ((info->extra_drop_info).
      super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
      super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl == (ExtraDropInfo *)0x0) {
    (this->extra_drop_info).
    super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
    super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl = (ExtraDropInfo *)0x0;
  }
  else {
    pEVar2 = unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true>::
             operator->(&info->extra_drop_info);
    (*pEVar2->_vptr_ExtraDropInfo[2])(&this->extra_drop_info,pEVar2);
  }
  return;
}

Assistant:

DropInfo::DropInfo(const DropInfo &info)
    : ParseInfo(info.info_type), type(info.type), catalog(info.catalog), schema(info.schema), name(info.name),
      if_not_found(info.if_not_found), cascade(info.cascade), allow_drop_internal(info.allow_drop_internal),
      extra_drop_info(info.extra_drop_info ? info.extra_drop_info->Copy() : nullptr) {
}